

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int r1f3kb_(int *ido,int *l1,double *cc,int *in1,double *ch,int *in2,double *wa1,double *wa2)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int *in_RCX;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  double dVar15;
  double dVar16;
  double taur;
  double taui;
  long in_stack_00000010;
  int idp2;
  double arg;
  int ic;
  int k;
  int i__;
  int i__2;
  int i__1;
  int ch_offset;
  int ch_dim3;
  int ch_dim2;
  int ch_dim1;
  int cc_offset;
  int cc_dim2;
  int cc_dim1;
  undefined4 local_64;
  undefined4 local_60;
  
  lVar11 = in_stack_00000010 + -8;
  lVar12 = (long)taui + -8;
  iVar2 = *in_RCX;
  iVar3 = *in_RDI;
  lVar13 = in_RDX + (long)(iVar2 * (iVar3 * 4 + 1) + 1) * -8;
  iVar4 = *in_R9;
  iVar5 = *in_RDI;
  iVar6 = *in_RSI;
  lVar14 = in_R8 + (long)(iVar4 * (iVar5 * (iVar6 + 1) + 1) + 1) * -8;
  dVar15 = atan(1.0);
  dVar15 = (dVar15 * 8.0) / 3.0;
  dVar16 = cos(dVar15);
  dVar15 = sin(dVar15);
  iVar7 = *in_RSI;
  for (local_64 = 1; local_64 <= iVar7; local_64 = local_64 + 1) {
    dVar1 = *(double *)(lVar13 + (long)((*in_RDI + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8);
    *(double *)(lVar14 + (long)(((local_64 + iVar6) * iVar5 + 1) * iVar4 + 1) * 8) =
         dVar1 + dVar1 +
         *(double *)(lVar13 + (long)(((local_64 * 3 + 1) * iVar3 + 1) * iVar2 + 1) * 8);
    *(double *)(lVar14 + (long)(((local_64 + iVar6 * 2) * iVar5 + 1) * iVar4 + 1) * 8) =
         -(dVar15 * 2.0) *
         *(double *)(lVar13 + (long)(((local_64 * 3 + 3) * iVar3 + 1) * iVar2 + 1) * 8) +
         dVar16 * 2.0 *
         *(double *)(lVar13 + (long)((*in_RDI + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8) +
         *(double *)(lVar13 + (long)(((local_64 * 3 + 1) * iVar3 + 1) * iVar2 + 1) * 8);
    *(double *)(lVar14 + (long)(((local_64 + iVar6 * 3) * iVar5 + 1) * iVar4 + 1) * 8) =
         dVar15 * 2.0 *
         *(double *)(lVar13 + (long)(((local_64 * 3 + 3) * iVar3 + 1) * iVar2 + 1) * 8) +
         dVar16 * 2.0 *
         *(double *)(lVar13 + (long)((*in_RDI + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8) +
         *(double *)(lVar13 + (long)(((local_64 * 3 + 1) * iVar3 + 1) * iVar2 + 1) * 8);
  }
  if (*in_RDI != 1) {
    iVar7 = *in_RDI;
    iVar8 = *in_RSI;
    for (local_64 = 1; local_64 <= iVar8; local_64 = local_64 + 1) {
      iVar9 = *in_RDI;
      for (local_60 = 3; local_60 <= iVar9; local_60 = local_60 + 2) {
        iVar10 = (iVar7 + 2) - local_60;
        *(double *)(lVar14 + (long)((local_60 + -1 + (local_64 + iVar6) * iVar5) * iVar4 + 1) * 8) =
             *(double *)
              (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8) +
             *(double *)
              (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8) +
             *(double *)
              (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8);
        *(double *)(lVar14 + (long)((local_60 + (local_64 + iVar6) * iVar5) * iVar4 + 1) * 8) =
             *(double *)(lVar13 + (long)((local_60 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8) +
             (*(double *)(lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8)
             - *(double *)(lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8));
        *(double *)
         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar6 * 2) * iVar5) * iVar4 + 1) * 8) =
             *(double *)(lVar12 + (long)(local_60 + -2) * 8) *
             (-dVar15 * (*(double *)
                          (lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8)
                        + *(double *)
                           (lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8))
             + dVar16 * (*(double *)
                          (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1)
                                    * 8) +
                        *(double *)
                         (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) *
                                   8)) +
               *(double *)
                (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8)) +
             -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
              (dVar15 * (*(double *)
                          (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1)
                                    * 8) -
                        *(double *)
                         (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) *
                                   8)) +
              dVar16 * (*(double *)
                         (lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8)
                       - *(double *)
                          (lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8))
              + *(double *)
                 (lVar13 + (long)((local_60 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8)));
        *(double *)(lVar14 + (long)((local_60 + (local_64 + iVar6 * 2) * iVar5) * iVar4 + 1) * 8) =
             *(double *)(lVar12 + (long)(local_60 + -2) * 8) *
             (dVar15 * (*(double *)
                         (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1)
                                   * 8) -
                       *(double *)
                        (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8
                        )) +
             dVar16 * (*(double *)
                        (lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8) -
                      *(double *)
                       (lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8)) +
             *(double *)(lVar13 + (long)((local_60 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8))
             + *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
               (-dVar15 * (*(double *)
                            (lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) *
                                      8) +
                          *(double *)
                           (lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8))
               + dVar16 * (*(double *)
                            (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 +
                                            1) * 8) +
                          *(double *)
                           (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1)
                                     * 8)) +
                 *(double *)
                  (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8));
        *(double *)
         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar6 * 3) * iVar5) * iVar4 + 1) * 8) =
             *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
             (dVar15 * (*(double *)
                         (lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8)
                       + *(double *)
                          (lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8))
             + dVar16 * (*(double *)
                          (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1)
                                    * 8) +
                        *(double *)
                         (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) *
                                   8)) +
               *(double *)
                (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8)) +
             -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
              (-dVar15 * (*(double *)
                           (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1
                                           ) * 8) -
                         *(double *)
                          (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) *
                                    8)) +
              dVar16 * (*(double *)
                         (lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8)
                       - *(double *)
                          (lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8))
              + *(double *)
                 (lVar13 + (long)((local_60 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8)));
        *(double *)(lVar14 + (long)((local_60 + (local_64 + iVar6 * 3) * iVar5) * iVar4 + 1) * 8) =
             *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
             (-dVar15 * (*(double *)
                          (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1)
                                    * 8) -
                        *(double *)
                         (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) *
                                   8)) +
             dVar16 * (*(double *)
                        (lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8) -
                      *(double *)
                       (lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) * 8)) +
             *(double *)(lVar13 + (long)((local_60 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8))
             + *(double *)(lVar11 + (long)(local_60 + -1) * 8) *
               (dVar15 * (*(double *)
                           (lVar13 + (long)((local_60 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1) * 8
                           ) + *(double *)
                                (lVar13 + (long)((iVar10 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1)
                                          * 8)) +
               dVar16 * (*(double *)
                          (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 3) * iVar3) * iVar2 + 1)
                                    * 8) +
                        *(double *)
                         (lVar13 + (long)((iVar10 + -1 + (local_64 * 3 + 2) * iVar3) * iVar2 + 1) *
                                   8)) +
               *(double *)
                (lVar13 + (long)((local_60 + -1 + (local_64 * 3 + 1) * iVar3) * iVar2 + 1) * 8));
      }
    }
  }
  return 0;
}

Assistant:

int r1f3kb_(int *ido, int *l1, fft_real_t *cc, int *
	in1, fft_real_t *ch, int *in2, fft_real_t *wa1, fft_real_t *wa2)
{
    /* System generated locals */
    int cc_dim1, cc_dim2, cc_offset, ch_dim1, ch_dim2, ch_dim3, ch_offset,
	     i__1, i__2;

    /* Builtin functions */

    /* Local variables */
     int i__, k, ic;
     fft_real_t arg;
     int idp2;
     fft_real_t taui, taur;


    /* Parameter adjustments */
    --wa2;
    --wa1;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + (cc_dim2 << 2));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    arg = atan(1.0) * 8.0 / 3.0;
    taur = cos(arg);
    taui = sin(arg);
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ch[((k + ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 + 1) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[(*ido + (k * 3 + 2) *
		cc_dim2) * cc_dim1 + 1] * 2.0;
	ch[((k + (ch_dim3 << 1)) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 +
		1) * cc_dim2 + 1) * cc_dim1 + 1] + taur * 2.0 * cc[(*ido + (k
		* 3 + 2) * cc_dim2) * cc_dim1 + 1] - taui * 2.0 * cc[((k * 3
		+ 3) * cc_dim2 + 1) * cc_dim1 + 1];
	ch[((k + ch_dim3 * 3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 + 1)
		* cc_dim2 + 1) * cc_dim1 + 1] + taur * 2.0 * cc[(*ido + (k *
		3 + 2) * cc_dim2) * cc_dim1 + 1] + taui * 2.0 * cc[((k * 3 +
		3) * cc_dim2 + 1) * cc_dim1 + 1];
/* L101: */
    }
    if (*ido == 1) {
	return 0;
    }
    idp2 = *ido + 2;
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    ch[(i__ - 1 + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ -
		    1 + (k * 3 + 1) * cc_dim2) * cc_dim1 + 1] + (cc[(i__ - 1
		    + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k
		    * 3 + 2) * cc_dim2) * cc_dim1 + 1]);
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     3 + 1) * cc_dim2) * cc_dim1 + 1] + (cc[(i__ + (k * 3 + 3)
		     * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]);
	    ch[(i__ - 1 + (k + (ch_dim3 << 1)) * ch_dim2) * ch_dim1 + 1] =
		    wa1[i__ - 2] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1])) - wa1[i__ - 1] * (cc[(i__ + (k * 3 + 1)
		    * cc_dim2) * cc_dim1 + 1] + taur * (cc[(i__ + (k * 3 + 3)
		    * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ - 1 + (k * 3 +
		    3) * cc_dim2) * cc_dim1 + 1] - cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k + (ch_dim3 << 1)) * ch_dim2) * ch_dim1 + 1] = wa1[
		    i__ - 2] * (cc[(i__ + (k * 3 + 1) * cc_dim2) * cc_dim1 +
		    1] + taur * (cc[(i__ + (k * 3 + 3) * cc_dim2) * cc_dim1 +
		    1] - cc[(ic + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]) +
		    taui * (cc[(i__ - 1 + (k * 3 + 3) * cc_dim2) * cc_dim1 +
		    1] - cc[(ic - 1 + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]))
		    + wa1[i__ - 1] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1]));
	    ch[(i__ - 1 + (k + ch_dim3 * 3) * ch_dim2) * ch_dim1 + 1] = wa2[
		    i__ - 2] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1])) - wa2[i__ - 1] * (cc[(i__ + (k * 3 + 1)
		    * cc_dim2) * cc_dim1 + 1] + taur * (cc[(i__ + (k * 3 + 3)
		    * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ - 1 + (k * 3 +
		    3) * cc_dim2) * cc_dim1 + 1] - cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k + ch_dim3 * 3) * ch_dim2) * ch_dim1 + 1] = wa2[i__ -
		    2] * (cc[(i__ + (k * 3 + 1) * cc_dim2) * cc_dim1 + 1] +
		    taur * (cc[(i__ + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] -
		    cc[(ic + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]) - taui * (
		    cc[(i__ - 1 + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    ic - 1 + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1])) + wa2[
		    i__ - 1] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1]));
/* L102: */
	}
/* L103: */
    }
    return 0;
}